

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O2

iterator * __thiscall
ft::setBase<int,_ft::less<int>,_ft::allocator<int>_>::lower_bound
          (iterator *__return_storage_ptr__,setBase<int,_ft::less<int>,_ft::allocator<int>_> *this,
          key_type_conflict *k)

{
  rbtree *prVar1;
  treeNode<int> *ptVar2;
  treeNode<int> *ptVar3;
  iterator *it;
  
  prVar1 = &(this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree;
  ptVar3 = ((this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_first
           )->parent;
  __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dcf0;
  __return_storage_ptr__->m_tree = prVar1;
  __return_storage_ptr__->m_node = ptVar3;
  while( true ) {
    ptVar2 = (this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_last
    ;
    if (ptVar3 == ptVar2) {
      __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dcf0;
      __return_storage_ptr__->m_tree = prVar1;
      __return_storage_ptr__->m_node = ptVar2;
      return __return_storage_ptr__;
    }
    if (*k <= ptVar3->value) break;
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(__return_storage_ptr__);
    ptVar3 = __return_storage_ptr__->m_node;
  }
  return __return_storage_ptr__;
}

Assistant:

iterator		lower_bound(key_type const & k)
	{
		for (iterator it = this->begin(); it != this->end(); ++it)
		{
			if (!this->key_comp()(*it, k)) return it;
		}
		return this->end();
	}